

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O3

target_ulong helper_vextuwrx_ppc64(target_ulong a,ppc_avr_t *b)

{
  byte bVar1;
  uint uVar2;
  byte bVar3;
  uint uVar4;
  
  uVar4 = (int)a << 3;
  bVar3 = (byte)uVar4;
  bVar1 = bVar3 & 0x3f;
  uVar2 = (uint)(b->u64[0] >> bVar1) | (uint)(b->s64[1] << 0x40 - bVar1);
  if ((uVar4 & 0x40) != 0) {
    uVar2 = (uint)(b->s64[1] >> (bVar3 & 0x3f));
  }
  return (ulong)uVar2;
}

Assistant:

void helper_vslv(ppc_avr_t *r, ppc_avr_t *a, ppc_avr_t *b)
{
    int i;
    unsigned int shift, bytes, size;

    size = ARRAY_SIZE(r->u8);
    for (i = 0; i < size; i++) {
        shift = b->VsrB(i) & 0x7;             /* extract shift value */
        bytes = (a->VsrB(i) << 8) +           /* extract adjacent bytes */
            (((i + 1) < size) ? a->VsrB(i + 1) : 0);
        r->VsrB(i) = (bytes << shift) >> 8;   /* shift and store result */
    }
}